

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O3

spv_result_t
anon_unknown.dwarf_176d726::spvTextEncodeOpcode
          (AssemblyGrammar *grammar,AssemblyContext *context,spv_instruction_t *pInst)

{
  spv_position_t *psVar1;
  spv_operand_type_t type;
  iterator __position;
  pointer puVar2;
  char cVar3;
  bool bVar4;
  spv_result_t sVar5;
  spv_result_t sVar6;
  int iVar7;
  int32_t iVar8;
  uint32_t uVar9;
  spv_opcode_desc psVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  size_type sVar14;
  spv_result_t unaff_EBP;
  char *pcVar15;
  _Alloc_hider _Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  uint uVar18;
  string opcodeName;
  spv_opcode_desc opcodeEntry;
  string result_id;
  spv_operand_pattern_t expectedOperands;
  spv_position_t nextPosition;
  string firstWord;
  string equal_sign;
  spv_position_t temp_pos;
  string local_2e8;
  spv_opcode_desc local_2c8;
  AssemblyGrammar *local_2c0;
  spv_position_t local_2b8;
  vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> local_298;
  spv_position_t local_278;
  spv_instruction_t *local_258;
  string local_250;
  string local_230;
  spv_position_t *local_210;
  DiagnosticStream local_208;
  
  cVar3 = spvtools::AssemblyContext::peek(context);
  paVar17 = &local_250.field_2;
  local_250._M_dataplus._M_p = (pointer)paVar17;
  if (cVar3 == '!') {
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_2b8.index = 0;
    local_2b8.line = 0;
    local_2b8.column = 0;
    sVar5 = spvtools::AssemblyContext::getWord(context,&local_250,&local_2b8);
    if (sVar5 == SPV_SUCCESS) {
      local_2c0 = grammar;
      local_258 = pInst;
      sVar5 = encodeImmediate(context,local_250._M_dataplus._M_p,pInst);
      if (sVar5 == SPV_SUCCESS) {
        local_210 = &context->current_position_;
        do {
          sVar6 = spvtools::AssemblyContext::advance(context);
          sVar5 = SPV_SUCCESS;
          if ((sVar6 == SPV_END_OF_STREAM) ||
             (bVar4 = spvtools::AssemblyContext::isStartOfNewInst(context), bVar4)) break;
          local_2e8._M_string_length = 0;
          local_2e8.field_2._M_local_buf[0] = '\0';
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          sVar5 = spvtools::AssemblyContext::getWord(context,&local_2e8,&local_2b8);
          if (sVar5 == SPV_SUCCESS) {
            iVar7 = std::__cxx11::string::compare((char *)&local_2e8);
            if (iVar7 == 0) {
              spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length
                        );
              lVar13 = 0x16;
              pcVar15 = " not allowed before =.";
              goto LAB_00296413;
            }
            local_208._0_8_ = (void *)0x0;
            local_208._8_8_ = 0;
            local_208._16_8_ = 0;
            sVar5 = spvTextEncodeOperand
                              (local_2c0,context,SPV_OPERAND_TYPE_OPTIONAL_CIV,
                               local_2e8._M_dataplus._M_p,local_258,
                               (spv_operand_pattern_t *)&local_208);
            bVar4 = sVar5 == SPV_SUCCESS;
            if (bVar4) {
              local_210->index = local_2b8.index;
              local_210->line = local_2b8.line;
              local_210->column = local_2b8.column;
              sVar5 = (spv_result_t)paVar17;
            }
            if ((void *)local_208._0_8_ != (void *)0x0) {
              operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
            }
          }
          else {
            spvtools::AssemblyContext::diagnostic(&local_208,context,sVar5);
            lVar13 = 0xe;
            pcVar15 = "Internal Error";
LAB_00296413:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar15,lVar13)
            ;
            sVar5 = local_208.error_;
            spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
            bVar4 = false;
          }
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)(uint)sVar5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,
                            CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                     local_2e8.field_2._M_local_buf[0]) + 1);
          }
        } while (bVar4);
      }
    }
    else {
      spvtools::AssemblyContext::diagnostic(&local_208,context,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Internal Error",0xe)
      ;
      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
      sVar5 = local_208.error_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) {
      return sVar5;
    }
    goto LAB_0029622b;
  }
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_278.index = 0;
  local_278.line = 0;
  local_278.column = 0;
  sVar5 = spvtools::AssemblyContext::getWord(context,&local_250,&local_278);
  if (sVar5 == SPV_SUCCESS) {
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    local_2b8.line = (size_t)&local_2b8.index;
    local_2b8.column = 0;
    local_2b8.index = local_2b8.index & 0xffffffffffffff00;
    local_2c0 = grammar;
    bVar4 = spvtools::AssemblyContext::startsWithOp(context);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_2e8);
LAB_00296299:
      sVar5 = spvtools::AssemblyGrammar::lookupOpcode
                        (local_2c0,local_2e8._M_dataplus._M_p + 2,&local_2c8);
      if (sVar5 == SPV_SUCCESS) {
        if (local_2c8->hasResult == true) {
          if (local_2b8.column != 0) goto LAB_00296678;
          spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,
                     "Expected <result-id> at the beginning of an instruction, found \'",0x40);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
          pcVar15 = "\'.";
          lVar13 = 2;
        }
        else {
          if (local_2b8.column == 0) {
LAB_00296678:
            pInst->opcode = local_2c8->opcode;
            (context->current_position_).index = local_278.index;
            (context->current_position_).line = local_278.line;
            (context->current_position_).column = local_278.column;
            local_208._0_8_ = local_208._0_8_ & 0xffffffff00000000;
            __position._M_current =
                 (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pInst->words,
                         __position,(uint *)&local_208);
            }
            else {
              *__position._M_current = 0;
              (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            local_298.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
            _M_impl.super__Vector_impl_data._M_start = (spv_operand_type_t *)0x0;
            local_298.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
            _M_impl.super__Vector_impl_data._M_finish = (spv_operand_type_t *)0x0;
            local_298.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (spv_operand_type_t *)0x0;
            std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::reserve
                      (&local_298,(ulong)local_2c8->numTypes);
            uVar12 = (uint)local_2c8->numTypes;
            if (local_2c8->numTypes != 0) {
              uVar18 = 0;
              iVar7 = -1;
              psVar10 = local_2c8;
              do {
                if (local_298.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_298.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
                  _M_realloc_insert<spv_operand_type_t_const&>
                            ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)
                             &local_298,
                             (iterator)
                             local_298.
                             super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             psVar10->operandTypes + (int)(uVar12 + iVar7));
                  psVar10 = local_2c8;
                }
                else {
                  *local_298.
                   super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish =
                       psVar10->operandTypes[(int)(uVar12 + iVar7)];
                  local_298.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_298.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                uVar18 = uVar18 + 1;
                uVar12 = (uint)psVar10->numTypes;
                iVar7 = iVar7 + -1;
              } while (uVar18 < uVar12);
            }
            if (local_298.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_298.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              psVar1 = &context->current_position_;
              do {
                type = local_298.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1];
                local_298.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_298.
                     super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1;
                bVar4 = spvExpandOperandSequenceOnce(type,&local_298);
                if (!bVar4) {
                  if ((type != SPV_OPERAND_TYPE_RESULT_ID) || (local_2b8.column == 0)) {
                    sVar5 = spvtools::AssemblyContext::advance(context);
                    if (sVar5 == SPV_SUCCESS) {
                      bVar4 = spvtools::AssemblyContext::isStartOfNewInst(context);
                      if (!bVar4) {
                        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                        local_230._M_string_length = 0;
                        local_230.field_2._M_local_buf[0] = '\0';
                        sVar5 = spvtools::AssemblyContext::getWord(context,&local_230,&local_278);
                        if (sVar5 == SPV_SUCCESS) {
                          sVar5 = spvTextEncodeOperand
                                            (local_2c0,context,type,local_230._M_dataplus._M_p,pInst
                                             ,&local_298);
                          if (sVar5 == SPV_SUCCESS) {
                            (context->current_position_).index = local_278.index;
                            psVar1->line = local_278.line;
                            (context->current_position_).column = local_278.column;
                            bVar4 = true;
                            sVar5 = unaff_EBP;
                          }
                          else {
                            if (sVar5 == SPV_FAILED_MATCH) {
                              bVar4 = spvOperandIsOptional(type);
                              sVar5 = (uint)!bVar4 << 2;
                              goto LAB_00296949;
                            }
                            bVar4 = false;
                          }
                        }
                        else {
                          spvtools::AssemblyContext::diagnostic(&local_208,context,sVar5);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,"Internal Error",0xe);
                          sVar5 = local_208.error_;
                          spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
LAB_00296949:
                          bVar4 = false;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_230._M_dataplus._M_p != &local_230.field_2) {
                          operator_delete(local_230._M_dataplus._M_p,
                                          CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                                   local_230.field_2._M_local_buf[0]) + 1);
                        }
                        unaff_EBP = sVar5;
                        if (bVar4) goto LAB_00296982;
                        goto LAB_00296ccd;
                      }
                      bVar4 = spvOperandIsOptional(type);
                      if (bVar4) break;
                      spvtools::AssemblyContext::diagnostic
                                (&local_208,context,SPV_ERROR_INVALID_TEXT);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Expected operand for ",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,local_2e8._M_dataplus._M_p,
                                 local_2e8._M_string_length);
                      pcVar15 = " instruction, but found the next instruction instead.";
                      lVar13 = 0x35;
                    }
                    else {
                      if (sVar5 != SPV_END_OF_STREAM) {
                        __assert_fail("error == SPV_SUCCESS && \"Somebody added another way to fail\""
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                                      ,0x284,
                                      "spv_result_t (anonymous namespace)::spvTextEncodeOpcode(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, spv_instruction_t *)"
                                     );
                      }
                      bVar4 = spvOperandIsOptional(type);
                      if (bVar4) break;
                      spvtools::AssemblyContext::diagnostic
                                (&local_208,context,SPV_ERROR_INVALID_TEXT);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Expected operand for ",0x15);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,local_2e8._M_dataplus._M_p,
                                 local_2e8._M_string_length);
                      pcVar15 = " instruction, but found the end of the stream.";
                      lVar13 = 0x2e;
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,pcVar15,lVar13);
                    sVar5 = local_208.error_;
                    goto LAB_00296cc8;
                  }
                  local_208._16_8_ = (context->current_position_).index;
                  local_208._0_8_ = psVar1->line;
                  local_208._8_8_ = (context->current_position_).column;
                  sVar5 = spvTextEncodeOperand
                                    (local_2c0,context,SPV_OPERAND_TYPE_RESULT_ID,
                                     (char *)local_2b8.line,pInst,(spv_operand_pattern_t *)0x0);
                  psVar1->line = local_208._0_8_;
                  (context->current_position_).column = local_208._8_8_;
                  (context->current_position_).index = local_208._16_8_;
                  if (sVar5 != SPV_SUCCESS) goto LAB_00296ccd;
                }
LAB_00296982:
              } while (local_298.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_start !=
                       local_298.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            }
            iVar8 = spvOpcodeGeneratesType(pInst->opcode);
            if (iVar8 == 0) {
              if (local_2c8->hasType == true) {
                if (local_2c8->hasResult == false) {
                  __assert_fail("opcodeEntry->hasResult && \"Unknown opcode: has a type but no result.\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                                ,0x2a8,
                                "spv_result_t (anonymous namespace)::spvTextEncodeOpcode(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, spv_instruction_t *)"
                               );
                }
                puVar2 = (pInst->words).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                spvtools::AssemblyContext::recordTypeIdForValue(context,puVar2[2],puVar2[1]);
              }
LAB_00296ba2:
              uVar11 = (long)(pInst->words).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(pInst->words).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2;
              if (uVar11 < 0x10000) {
                uVar9 = spvOpcodeMake((uint16_t)uVar11,local_2c8->opcode);
                *(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start = uVar9;
                sVar5 = SPV_SUCCESS;
              }
              else {
                spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_2e8._M_dataplus._M_p,
                           local_2e8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208," Instruction too long: ",0x17);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208," words, but the limit is ",0x19);
                std::ostream::operator<<(&local_208,0xffff);
                sVar5 = local_208.error_;
LAB_00296cc8:
                spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
              }
            }
            else {
              sVar6 = spvtools::AssemblyContext::recordTypeDefinition(context,pInst);
              sVar5 = SPV_ERROR_INVALID_TEXT;
              if (sVar6 == SPV_SUCCESS) goto LAB_00296ba2;
            }
LAB_00296ccd:
            if (local_298.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_start != (spv_operand_type_t *)0x0) {
              operator_delete(local_298.
                              super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_298.
                                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_298.
                                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_00296cf6;
          }
          spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Cannot set ID ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,(char *)local_2b8.line,local_2b8.column);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," because ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
          pcVar15 = " does not produce a result ID.";
          lVar13 = 0x1e;
        }
      }
      else {
        spvtools::AssemblyContext::diagnostic(&local_208,context,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Invalid Opcode name \'",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
        pcVar15 = "\'";
        lVar13 = 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar15,lVar13);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
      sVar5 = local_208.error_;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_2b8);
      if (*(char *)local_2b8.line == '%') {
        (context->current_position_).index = local_278.index;
        (context->current_position_).line = local_278.line;
        (context->current_position_).column = local_278.column;
        sVar5 = spvtools::AssemblyContext::advance(context);
        if (sVar5 == SPV_SUCCESS) {
          local_230._M_string_length = 0;
          local_230.field_2._M_local_buf[0] = '\0';
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          spvtools::AssemblyContext::getWord(context,&local_230,&local_278);
          iVar7 = std::__cxx11::string::compare((char *)&local_230);
          if (iVar7 == 0) {
            (context->current_position_).index = local_278.index;
            (context->current_position_).line = local_278.line;
            (context->current_position_).column = local_278.column;
            local_258 = pInst;
            sVar5 = spvtools::AssemblyContext::advance(context);
            if (sVar5 != SPV_SUCCESS) {
              spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
              pcVar15 = "Expected opcode, found end of stream.";
              lVar13 = 0x25;
              goto LAB_00296a84;
            }
            sVar5 = spvtools::AssemblyContext::getWord(context,&local_2e8,&local_278);
            if (sVar5 != SPV_SUCCESS) {
              spvtools::AssemblyContext::diagnostic(&local_208,context,sVar5);
              pcVar15 = "Internal Error";
              lVar13 = 0xe;
              goto LAB_00296a84;
            }
            bVar4 = spvtools::AssemblyContext::startsWithOp(context);
            if (!bVar4) {
              spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Invalid Opcode prefix \'",0x17);
              sVar14 = local_2e8._M_string_length;
              _Var16._M_p = local_2e8._M_dataplus._M_p;
              goto LAB_00296756;
            }
            bVar4 = true;
          }
          else {
            local_258 = pInst;
            spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"\'=\' expected after result id but found \'",0x28);
            sVar14 = local_230._M_string_length;
            _Var16._M_p = local_230._M_dataplus._M_p;
LAB_00296756:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,_Var16._M_p,sVar14);
            pcVar15 = "\'.";
            lVar13 = 2;
LAB_00296a84:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar15,lVar13)
            ;
            unaff_EBP = local_208.error_;
            spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,
                            CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                     local_230.field_2._M_local_buf[0]) + 1);
          }
          pInst = local_258;
          sVar5 = unaff_EBP;
          if (bVar4) goto LAB_00296299;
          goto LAB_00296cf6;
        }
        spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
        pcVar15 = "Expected \'=\', found end of stream.";
        lVar13 = 0x22;
      }
      else {
        spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,
                   "Expected <opcode> or <result-id> at the beginning of an instruction, found \'",
                   0x4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,(char *)local_2b8.line,local_2b8.column);
        pcVar15 = "\'.";
        lVar13 = 2;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar15,lVar13);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
      sVar5 = local_208.error_;
    }
LAB_00296cf6:
    if ((size_t *)local_2b8.line != &local_2b8.index) {
      operator_delete((void *)local_2b8.line,local_2b8.index + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                               local_2e8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Internal Error",0xe);
    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
    sVar5 = local_208.error_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == &local_250.field_2) {
    return sVar5;
  }
LAB_0029622b:
  operator_delete(local_250._M_dataplus._M_p,
                  CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                           local_250.field_2._M_local_buf[0]) + 1);
  return sVar5;
}

Assistant:

spv_result_t spvTextEncodeOpcode(const spvtools::AssemblyGrammar& grammar,
                                 spvtools::AssemblyContext* context,
                                 spv_instruction_t* pInst) {
  // Check for !<integer> first.
  if ('!' == context->peek()) {
    return encodeInstructionStartingWithImmediate(grammar, context, pInst);
  }

  std::string firstWord;
  spv_position_t nextPosition = {};
  spv_result_t error = context->getWord(&firstWord, &nextPosition);
  if (error) return context->diagnostic() << "Internal Error";

  std::string opcodeName;
  std::string result_id;
  spv_position_t result_id_position = {};
  if (context->startsWithOp()) {
    opcodeName = firstWord;
  } else {
    result_id = firstWord;
    if ('%' != result_id.front()) {
      return context->diagnostic()
             << "Expected <opcode> or <result-id> at the beginning "
                "of an instruction, found '"
             << result_id << "'.";
    }
    result_id_position = context->position();

    // The '=' sign.
    context->setPosition(nextPosition);
    if (context->advance())
      return context->diagnostic() << "Expected '=', found end of stream.";
    std::string equal_sign;
    error = context->getWord(&equal_sign, &nextPosition);
    if ("=" != equal_sign)
      return context->diagnostic() << "'=' expected after result id but found '"
                                   << equal_sign << "'.";

    // The <opcode> after the '=' sign.
    context->setPosition(nextPosition);
    if (context->advance())
      return context->diagnostic() << "Expected opcode, found end of stream.";
    error = context->getWord(&opcodeName, &nextPosition);
    if (error) return context->diagnostic(error) << "Internal Error";
    if (!context->startsWithOp()) {
      return context->diagnostic()
             << "Invalid Opcode prefix '" << opcodeName << "'.";
    }
  }

  // NOTE: The table contains Opcode names without the "Op" prefix.
  const char* pInstName = opcodeName.data() + 2;

  spv_opcode_desc opcodeEntry;
  error = grammar.lookupOpcode(pInstName, &opcodeEntry);
  if (error) {
    return context->diagnostic(error)
           << "Invalid Opcode name '" << opcodeName << "'";
  }
  if (opcodeEntry->hasResult && result_id.empty()) {
    return context->diagnostic()
           << "Expected <result-id> at the beginning of an instruction, found '"
           << firstWord << "'.";
  }
  if (!opcodeEntry->hasResult && !result_id.empty()) {
    return context->diagnostic()
           << "Cannot set ID " << result_id << " because " << opcodeName
           << " does not produce a result ID.";
  }
  pInst->opcode = opcodeEntry->opcode;
  context->setPosition(nextPosition);
  // Reserve the first word for the instruction.
  spvInstructionAddWord(pInst, 0);

  // Maintains the ordered list of expected operand types.
  // For many instructions we only need the {numTypes, operandTypes}
  // entries in opcodeEntry.  However, sometimes we need to modify
  // the list as we parse the operands. This occurs when an operand
  // has its own logical operands (such as the LocalSize operand for
  // ExecutionMode), or for extended instructions that may have their
  // own operands depending on the selected extended instruction.
  spv_operand_pattern_t expectedOperands;
  expectedOperands.reserve(opcodeEntry->numTypes);
  for (auto i = 0; i < opcodeEntry->numTypes; i++)
    expectedOperands.push_back(
        opcodeEntry->operandTypes[opcodeEntry->numTypes - i - 1]);

  while (!expectedOperands.empty()) {
    const spv_operand_type_t type = expectedOperands.back();
    expectedOperands.pop_back();

    // Expand optional tuples lazily.
    if (spvExpandOperandSequenceOnce(type, &expectedOperands)) continue;

    if (type == SPV_OPERAND_TYPE_RESULT_ID && !result_id.empty()) {
      // Handle the <result-id> for value generating instructions.
      // We've already consumed it from the text stream.  Here
      // we inject its words into the instruction.
      spv_position_t temp_pos = context->position();
      error = spvTextEncodeOperand(grammar, context, SPV_OPERAND_TYPE_RESULT_ID,
                                   result_id.c_str(), pInst, nullptr);
      result_id_position = context->position();
      // Because we are injecting we have to reset the position afterwards.
      context->setPosition(temp_pos);
      if (error) return error;
    } else {
      // Find the next word.
      error = context->advance();
      if (error == SPV_END_OF_STREAM) {
        if (spvOperandIsOptional(type)) {
          // This would have been the last potential operand for the
          // instruction,
          // and we didn't find one.  We're finished parsing this instruction.
          break;
        } else {
          return context->diagnostic()
                 << "Expected operand for " << opcodeName
                 << " instruction, but found the end of the stream.";
        }
      }
      assert(error == SPV_SUCCESS && "Somebody added another way to fail");

      if (context->isStartOfNewInst()) {
        if (spvOperandIsOptional(type)) {
          break;
        } else {
          return context->diagnostic()
                 << "Expected operand for " << opcodeName
                 << " instruction, but found the next instruction instead.";
        }
      }

      std::string operandValue;
      error = context->getWord(&operandValue, &nextPosition);
      if (error) return context->diagnostic(error) << "Internal Error";

      error = spvTextEncodeOperand(grammar, context, type, operandValue.c_str(),
                                   pInst, &expectedOperands);

      if (error == SPV_FAILED_MATCH && spvOperandIsOptional(type))
        return SPV_SUCCESS;

      if (error) return error;

      context->setPosition(nextPosition);
    }
  }

  if (spvOpcodeGeneratesType(pInst->opcode)) {
    if (context->recordTypeDefinition(pInst) != SPV_SUCCESS) {
      return SPV_ERROR_INVALID_TEXT;
    }
  } else if (opcodeEntry->hasType) {
    // SPIR-V dictates that if an instruction has both a return value and a
    // type ID then the type id is first, and the return value is second.
    assert(opcodeEntry->hasResult &&
           "Unknown opcode: has a type but no result.");
    context->recordTypeIdForValue(pInst->words[2], pInst->words[1]);
  }

  if (pInst->words.size() > SPV_LIMIT_INSTRUCTION_WORD_COUNT_MAX) {
    return context->diagnostic()
           << opcodeName << " Instruction too long: " << pInst->words.size()
           << " words, but the limit is "
           << SPV_LIMIT_INSTRUCTION_WORD_COUNT_MAX;
  }

  pInst->words[0] =
      spvOpcodeMake(uint16_t(pInst->words.size()), opcodeEntry->opcode);

  return SPV_SUCCESS;
}